

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O2

void cl_send_cb(uv_udp_send_t *req,int status)

{
  char *pcVar1;
  undefined8 uStackY_30;
  
  if (req == (uv_udp_send_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-immediate.c"
            ,0x3b,"req","!=","NULL",0,"!=",0);
    abort();
  }
  if (status == 0) {
    if (req->handle == &client || req->handle == &server) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return;
    }
    pcVar1 = "(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client";
    uStackY_30 = 0x3d;
  }
  else {
    pcVar1 = "status == 0";
    uStackY_30 = 0x3c;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-immediate.c"
          ,uStackY_30,pcVar1);
  abort();
}

Assistant:

static void cl_send_cb(uv_udp_send_t* req, int status) {
  int r;

  ASSERT_NOT_NULL(req);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);
  if (++cl_send_cb_called == 1) {
    uv_udp_connect(&client, NULL);
    r = uv_udp_send(req, &client, &buf, 1, NULL, cl_send_cb);
    ASSERT(r == UV_EDESTADDRREQ);
    r = uv_udp_send(req,
                    &client,
                    &buf,
                    1,
                    (const struct sockaddr*) &lo_addr,
                    cl_send_cb);
    ASSERT(r == 0);
  }

}